

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O2

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessNode
          (MakeLeftHandedProcess *this,aiNode *pNode,aiMatrix4x4 *pParentGlobalRotation)

{
  aiNode *pNode_00;
  size_t a;
  ulong uVar1;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4t<float> local_78;
  
  uVar1._0_4_ = (pNode->mTransformation).c1;
  uVar1._4_4_ = (pNode->mTransformation).c2;
  (pNode->mTransformation).c1 = (float)(int)(uVar1 ^ 0x8000000080000000);
  (pNode->mTransformation).c2 = (float)(int)((uVar1 ^ 0x8000000080000000) >> 0x20);
  (pNode->mTransformation).c4 = -(pNode->mTransformation).c4;
  (pNode->mTransformation).a3 = -(pNode->mTransformation).a3;
  (pNode->mTransformation).b3 = -(pNode->mTransformation).b3;
  (pNode->mTransformation).d3 = -(pNode->mTransformation).d3;
  for (uVar1 = 0; uVar1 < pNode->mNumChildren; uVar1 = uVar1 + 1) {
    pNode_00 = pNode->mChildren[uVar1];
    local_78.a1 = pParentGlobalRotation->a1;
    local_78.a2 = pParentGlobalRotation->a2;
    local_78.a3 = pParentGlobalRotation->a3;
    local_78.a4 = pParentGlobalRotation->a4;
    local_78.b1 = pParentGlobalRotation->b1;
    local_78.b2 = pParentGlobalRotation->b2;
    local_78.b3 = pParentGlobalRotation->b3;
    local_78.b4 = pParentGlobalRotation->b4;
    local_78.c1 = pParentGlobalRotation->c1;
    local_78.c2 = pParentGlobalRotation->c2;
    local_78.c3 = pParentGlobalRotation->c3;
    local_78.c4 = pParentGlobalRotation->c4;
    local_78.d1 = pParentGlobalRotation->d1;
    local_78.d2 = pParentGlobalRotation->d2;
    local_78.d3 = pParentGlobalRotation->d3;
    local_78.d4 = pParentGlobalRotation->d4;
    aiMatrix4x4t<float>::operator*=(&local_78,&pNode->mTransformation);
    ProcessNode(this,pNode_00,&local_78);
  }
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessNode( aiNode* pNode, const aiMatrix4x4& pParentGlobalRotation)
{
    // mirror all base vectors at the local Z axis
    pNode->mTransformation.c1 = -pNode->mTransformation.c1;
    pNode->mTransformation.c2 = -pNode->mTransformation.c2;
    pNode->mTransformation.c3 = -pNode->mTransformation.c3;
    pNode->mTransformation.c4 = -pNode->mTransformation.c4;

    // now invert the Z axis again to keep the matrix determinant positive.
    // The local meshes will be inverted accordingly so that the result should look just fine again.
    pNode->mTransformation.a3 = -pNode->mTransformation.a3;
    pNode->mTransformation.b3 = -pNode->mTransformation.b3;
    pNode->mTransformation.c3 = -pNode->mTransformation.c3;
    pNode->mTransformation.d3 = -pNode->mTransformation.d3; // useless, but anyways...

    // continue for all children
    for( size_t a = 0; a < pNode->mNumChildren; ++a ) {
        ProcessNode( pNode->mChildren[ a ], pParentGlobalRotation * pNode->mTransformation );
    }
}